

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader.cc
# Opt level: O1

Result __thiscall
wabt::anon_unknown_25::BinaryReader::CallbackMemLocation
          (BinaryReader *this,Address *alignment_log2,Index *memidx,Address *offset,
          uint8_t *lane_val)

{
  uint uVar1;
  BinaryReaderDelegate *pBVar2;
  int iVar3;
  Enum EVar4;
  _func_int **pp_Var5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  char *format;
  
  uVar1 = *memidx;
  pBVar2 = this->delegate_;
  uVar6 = (ulong)(uint)*offset;
  if (lane_val == (uint8_t *)0x0) {
    pp_Var5 = pBVar2->_vptr_BinaryReaderDelegate;
    uVar7 = uVar6;
    uVar8 = (ulong)uVar1;
    if (uVar1 != 0) goto LAB_00119552;
    iVar3 = (*pp_Var5[0x3c])(pBVar2,(ulong)(uint)*alignment_log2,uVar6);
    if (iVar3 != 0) {
      format = "OnOpcodeUint32Uint32 callback failed";
      goto LAB_00119563;
    }
LAB_00119574:
    EVar4 = Ok;
  }
  else {
    uVar7 = (ulong)*lane_val;
    pp_Var5 = pBVar2->_vptr_BinaryReaderDelegate;
    uVar8 = uVar6;
    if (uVar1 == 0) {
LAB_00119552:
      iVar3 = (*pp_Var5[0x3d])(pBVar2,(ulong)(uint)*alignment_log2,uVar8,uVar7);
      if (iVar3 == 0) goto LAB_00119574;
      format = "OnOpcodeUint32Uint32Uint32 callback failed";
    }
    else {
      iVar3 = (*pp_Var5[0x3e])();
      if (iVar3 == 0) goto LAB_00119574;
      format = "OnOpcodeUint32Uint32Uint32Uint32 callback failed";
    }
LAB_00119563:
    PrintError(this,format);
    EVar4 = Error;
  }
  return (Result)EVar4;
}

Assistant:

Result BinaryReader::CallbackMemLocation(const Address* alignment_log2,
                                         const Index* memidx,
                                         const Address* offset,
                                         const uint8_t* lane_val) {
  if (lane_val) {
    if (*memidx) {
      CALLBACK(OnOpcodeUint32Uint32Uint32Uint32, *alignment_log2, *memidx,
               *offset, *lane_val);
    } else {
      CALLBACK(OnOpcodeUint32Uint32Uint32, *alignment_log2, *offset, *lane_val);
    }
  } else {
    if (*memidx) {
      CALLBACK(OnOpcodeUint32Uint32Uint32, *alignment_log2, *memidx, *offset);
    } else {
      CALLBACK(OnOpcodeUint32Uint32, *alignment_log2, *offset);
    }
  }

  return Result::Ok;
}